

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi64 jx9TokenValueToInt64(SyString *pVal)

{
  char cVar1;
  SyString *pSStack_20;
  sxi32 c;
  sxi64 iVal;
  SyString *pVal_local;
  
  pSStack_20 = (SyString *)0x0;
  if (pVal->nByte == 0) {
    pVal_local = (SyString *)0x0;
  }
  else {
    iVal = (sxi64)pVal;
    if (*pVal->zString == '0') {
      if (pVal->nByte == 1) {
        return 0;
      }
      cVar1 = pVal->zString[1];
      if ((cVar1 == 'x') || (cVar1 == 'X')) {
        SyHexStrToInt64(pVal->zString,pVal->nByte,&stack0xffffffffffffffe0,(char **)0x0);
      }
      else if ((cVar1 == 'b') || (cVar1 == 'B')) {
        SyBinaryStrToInt64(pVal->zString,pVal->nByte,&stack0xffffffffffffffe0,(char **)0x0);
      }
      else {
        SyOctalStrToInt64(pVal->zString,pVal->nByte,&stack0xffffffffffffffe0,(char **)0x0);
      }
    }
    else {
      SyStrToInt64(pVal->zString,pVal->nByte,&stack0xffffffffffffffe0,(char **)0x0);
    }
    pVal_local = pSStack_20;
  }
  return (sxi64)pVal_local;
}

Assistant:

JX9_PRIVATE sxi64 jx9TokenValueToInt64(SyString *pVal)
{
	sxi64 iVal = 0;
	if( pVal->nByte <= 0 ){
		return 0;
	}
	if( pVal->zString[0] == '0' ){
		sxi32 c;
		if( pVal->nByte == sizeof(char) ){
			return 0;
		}
		c = pVal->zString[1];
		if( c  == 'x' || c == 'X' ){
			/* Hex digit stream */
			SyHexStrToInt64(pVal->zString, pVal->nByte, (void *)&iVal, 0);
		}else if( c == 'b' || c == 'B' ){
			/* Binary digit stream */
			SyBinaryStrToInt64(pVal->zString, pVal->nByte, (void *)&iVal, 0);
		}else{
			/* Octal digit stream */
			SyOctalStrToInt64(pVal->zString, pVal->nByte, (void *)&iVal, 0);
		}
	}else{
		/* Decimal digit stream */
		SyStrToInt64(pVal->zString, pVal->nByte, (void *)&iVal, 0);
	}
	return iVal;
}